

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextUpdateDocking(ImGuiContext *ctx)

{
  int *piVar1;
  int iVar2;
  ImGuiDockContext *pIVar3;
  ImGuiDockRequest *pIVar4;
  ImGuiDockNode *node;
  ImGuiDockRequest *__dest;
  uint uVar5;
  ImGuiContext *g;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  if (((ctx->IO).ConfigFlags & 0x40) != 0) {
    pIVar3 = ctx->DockContext;
    if (0 < (pIVar3->Requests).Size) {
      lVar7 = 0;
      lVar6 = 0;
      do {
        pIVar4 = (pIVar3->Requests).Data;
        if (*(int *)((long)&pIVar4->Type + lVar7) == 1) {
          DockContextProcessDock(ctx,(ImGuiDockRequest *)((long)&pIVar4->Type + lVar7));
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x40;
      } while (lVar6 < (pIVar3->Requests).Size);
    }
    iVar2 = (pIVar3->Requests).Capacity;
    if (iVar2 < 0) {
      uVar5 = iVar2 / 2 + iVar2;
      uVar8 = 0;
      if (0 < (int)uVar5) {
        uVar8 = (ulong)uVar5;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiDockRequest *)(*GImAllocatorAllocFunc)(uVar8 << 6,GImAllocatorUserData);
      pIVar4 = (pIVar3->Requests).Data;
      if (pIVar4 != (ImGuiDockRequest *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar3->Requests).Size << 6);
        pIVar4 = (pIVar3->Requests).Data;
        if ((pIVar4 != (ImGuiDockRequest *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar3->Requests).Data = __dest;
      (pIVar3->Requests).Capacity = (int)uVar8;
    }
    (pIVar3->Requests).Size = 0;
    if (0 < (pIVar3->Nodes).Data.Size) {
      lVar6 = 8;
      lVar7 = 0;
      do {
        node = *(ImGuiDockNode **)((long)&((pIVar3->Nodes).Data.Data)->key + lVar6);
        if (((node != (ImGuiDockNode *)0x0) && (node->ParentNode == (ImGuiDockNode *)0x0)) &&
           ((node->LocalFlags & 0x400U) == 0)) {
          DockNodeUpdate(node);
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar7 < (pIVar3->Nodes).Data.Size);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateDocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Process Docking requests
    for (int n = 0; n < dc->Requests.Size; n++)
        if (dc->Requests[n].Type == ImGuiDockRequestType_Dock)
            DockContextProcessDock(ctx, &dc->Requests[n]);
    dc->Requests.resize(0);

    // Create windows for each automatic docking nodes
    // We can have NULL pointers when we delete nodes, but because ID are recycled this should amortize nicely (and our node count will never be very high)
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsFloatingNode())
                DockNodeUpdate(node);
}